

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec_util.c
# Opt level: O3

void dec_update_map(com_core_t *core)

{
  s16 (*paasVar1) [2] [2];
  s8 (*pasVar2) [2];
  u32 *puVar3;
  com_scu_t *pcVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  s16 asVar7 [2];
  uint uVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  s16 (*paasVar13) [2] [2];
  uint uVar14;
  uint uVar15;
  s16 aasVar16 [2] [2];
  com_scu_t cVar17;
  int iVar18;
  byte bVar19;
  s8 asVar20 [2];
  int iVar21;
  ulong uVar22;
  uint uVar23;
  uint *puVar24;
  long lVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  long lVar29;
  s32 (*paasVar30) [1024] [2];
  int iVar31;
  uint uVar32;
  s16 (*pasVar33) [2];
  byte bVar34;
  ushort uVar35;
  int iVar36;
  s16 asVar37 [2];
  uint uVar38;
  uint uVar39;
  byte bVar40;
  uint uVar41;
  uint uVar42;
  int iVar43;
  ulong uVar44;
  int iVar45;
  uint uVar46;
  uint uVar47;
  long lVar48;
  s8 (*pasVar49) [2];
  ulong uVar50;
  byte bVar51;
  int iVar52;
  int iVar53;
  uint uVar54;
  int iVar55;
  uint uVar56;
  com_scu_t *__s;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 in_XMM7 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 in_XMM8 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  s32 (*local_138) [1024] [2];
  s16 (*local_120) [2] [2];
  s16 (*local_c0) [2] [2];
  int local_b8;
  int local_b4;
  int local_b0;
  int local_ac;
  undefined8 local_88;
  int iStack_80;
  int iStack_7c;
  
  uVar10 = core->cu_log2w;
  uVar14 = uVar10 - 2;
  uVar8 = 1 << ((byte)uVar14 & 0x1f);
  iVar45 = core->cu_log2h - 2;
  iVar9 = 1 << ((byte)iVar45 & 0x1f);
  lVar12 = (long)core->cu_scup;
  pasVar2 = (core->map).map_refi;
  puVar3 = (core->map).map_pos;
  pcVar4 = (core->map).map_scu;
  bVar40 = (core->cu_mode != 0) * '\x02' + 3;
  bVar34 = core->affine_flag;
  bVar51 = 0x10;
  if ((*(int *)core->cbfy == 0) && (*(short *)core->cbfc == 0)) {
    bVar51 = bVar40 * '\b' & 0x10;
  }
  asVar20 = *&core->refi;
  iVar31 = core->seqhdr->i_scu;
  lVar48 = (long)iVar31;
  pasVar49 = pasVar2 + lVar12;
  puVar24 = puVar3 + lVar12;
  cVar17 = (com_scu_t)((core->cu_mode == 2) << 3 | (bVar34 & 3) << 5 | bVar51 | bVar40);
  uVar23 = core->cu_scup << 6 | (uVar10 & 7) + (core->cu_log2h & 7U) * 8;
  __s = pcVar4 + lVar12;
  if (bVar34 == 0) {
    paasVar13 = (core->map).map_mv;
    if (uVar14 < 2) {
      if (uVar14 == 1) {
        if (iVar45 == 0x1f) goto LAB_0010c67d;
        aasVar16 = *&core->mv;
        iVar45 = 1;
        if (1 < iVar9) {
          iVar45 = iVar9;
        }
        do {
          puVar24 = puVar24 + lVar48;
          *(ushort *)(pcVar4 + lVar12) = CONCAT11(cVar17,cVar17);
          *(uint *)(pasVar2 + lVar12) = CONCAT22(asVar20,asVar20);
          paasVar13[lVar12] = aasVar16;
          paasVar13[lVar12 + 1] = aasVar16;
          puVar3[(ulong)(uVar8 - 1) + lVar12] = uVar23;
          lVar12 = lVar12 + lVar48;
          iVar45 = iVar45 + -1;
        } while (iVar45 != 0);
      }
      else {
        if (iVar45 == 0x1f) goto LAB_0010c67d;
        iVar45 = 1;
        if (1 < iVar9) {
          iVar45 = iVar9;
        }
        do {
          pcVar4[lVar12] = cVar17;
          pasVar2[lVar12] = asVar20;
          paasVar13[lVar12] = *&core->mv;
          *puVar24 = uVar23;
          lVar12 = lVar12 + lVar48;
          puVar24 = puVar24 + lVar48;
          iVar45 = iVar45 + -1;
        } while (iVar45 != 0);
      }
    }
    else if (iVar45 != 0x1f) {
      paasVar13 = paasVar13 + lVar12;
      iVar45 = 1;
      if (1 < iVar9) {
        iVar45 = iVar9;
      }
      asVar37 = core->mv[0];
      asVar7 = core->mv[1];
      iVar9 = 0;
      do {
        if (uVar14 != 0x1f) {
          lVar12 = 0;
          do {
            *(uint *)(__s + lVar12) = (uint)(byte)cVar17 * 0x1010101;
            *(ulong *)(pasVar49 + lVar12) = (ulong)(ushort)asVar20 * 0x1000100010001;
            paasVar1 = paasVar13 + lVar12 + 2;
            (*paasVar1)[0] = asVar37;
            (*paasVar1)[1] = asVar7;
            paasVar1[1][0] = asVar37;
            paasVar1[1][1] = asVar7;
            paasVar1 = paasVar13 + lVar12;
            (*paasVar1)[0] = asVar37;
            (*paasVar1)[1] = asVar7;
            paasVar1[1][0] = asVar37;
            paasVar1[1][1] = asVar7;
            lVar12 = lVar12 + 4;
          } while (lVar12 < (int)uVar8);
        }
        puVar24[(int)(uVar8 - 1)] = uVar23;
        puVar24 = puVar24 + lVar48;
        iVar9 = iVar9 + 1;
        paasVar13 = paasVar13 + lVar48;
        pasVar49 = pasVar49 + lVar48;
        __s = __s + lVar48;
      } while (iVar9 != iVar45);
    }
  }
  else {
    if (iVar45 == 0x1f) {
      bVar40 = 0x21;
    }
    else {
      uVar22 = 1;
      if (1 < (int)uVar8) {
        uVar22 = (ulong)uVar8;
      }
      iVar45 = 1;
      if (1 < iVar9) {
        iVar45 = iVar9;
      }
      lVar25 = uVar22 - 1;
      auVar82._8_4_ = (int)lVar25;
      auVar82._0_8_ = lVar25;
      auVar82._12_4_ = (int)((ulong)lVar25 >> 0x20);
      iVar9 = 0;
      auVar82 = auVar82 ^ _DAT_00163a40;
      do {
        memset(__s,(uint)(byte)cVar17,(long)(int)uVar8);
        auVar59 = _DAT_00163a40;
        local_88._0_4_ = auVar82._0_4_;
        local_88._4_4_ = auVar82._4_4_;
        iStack_80 = auVar82._8_4_;
        iStack_7c = auVar82._12_4_;
        if (uVar14 != 0x1f) {
          uVar50 = 0;
          auVar78 = _DAT_00163a30;
          auVar58 = _DAT_00163a20;
          auVar60 = _DAT_00163a10;
          auVar62 = _DAT_00163a00;
          do {
            auVar63 = auVar78 ^ auVar59;
            iVar55 = -(uint)((int)local_88 < auVar63._0_4_);
            auVar64._4_4_ = -(uint)(local_88._4_4_ < auVar63._4_4_);
            iVar36 = -(uint)(iStack_80 < auVar63._8_4_);
            auVar64._12_4_ = -(uint)(iStack_7c < auVar63._12_4_);
            auVar73._4_4_ = iVar55;
            auVar73._0_4_ = iVar55;
            auVar73._8_4_ = iVar36;
            auVar73._12_4_ = iVar36;
            auVar79 = pshuflw(in_XMM7,auVar73,0xe8);
            auVar66._4_4_ = -(uint)(auVar63._4_4_ == local_88._4_4_);
            auVar66._12_4_ = -(uint)(auVar63._12_4_ == iStack_7c);
            auVar66._0_4_ = auVar66._4_4_;
            auVar66._8_4_ = auVar66._12_4_;
            auVar81 = pshuflw(in_XMM8,auVar66,0xe8);
            auVar64._0_4_ = auVar64._4_4_;
            auVar64._8_4_ = auVar64._12_4_;
            auVar80 = pshuflw(auVar79,auVar64,0xe8);
            auVar63._8_4_ = 0xffffffff;
            auVar63._0_8_ = 0xffffffffffffffff;
            auVar63._12_4_ = 0xffffffff;
            auVar63 = (auVar80 | auVar81 & auVar79) ^ auVar63;
            auVar63 = packssdw(auVar63,auVar63);
            if ((auVar63 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              pasVar49[uVar50] = asVar20;
            }
            auVar64 = auVar66 & auVar73 | auVar64;
            auVar63 = packssdw(auVar64,auVar64);
            auVar80._8_4_ = 0xffffffff;
            auVar80._0_8_ = 0xffffffffffffffff;
            auVar80._12_4_ = 0xffffffff;
            auVar63 = packssdw(auVar63 ^ auVar80,auVar63 ^ auVar80);
            if ((auVar63._0_4_ >> 0x10 & 1) != 0) {
              pasVar49[uVar50 + 1] = asVar20;
            }
            auVar63 = auVar58 ^ auVar59;
            iVar55 = -(uint)((int)local_88 < auVar63._0_4_);
            auVar76._4_4_ = -(uint)(local_88._4_4_ < auVar63._4_4_);
            iVar36 = -(uint)(iStack_80 < auVar63._8_4_);
            auVar76._12_4_ = -(uint)(iStack_7c < auVar63._12_4_);
            auVar65._4_4_ = iVar55;
            auVar65._0_4_ = iVar55;
            auVar65._8_4_ = iVar36;
            auVar65._12_4_ = iVar36;
            auVar72._4_4_ = -(uint)(auVar63._4_4_ == local_88._4_4_);
            auVar72._12_4_ = -(uint)(auVar63._12_4_ == iStack_7c);
            auVar72._0_4_ = auVar72._4_4_;
            auVar72._8_4_ = auVar72._12_4_;
            auVar76._0_4_ = auVar76._4_4_;
            auVar76._8_4_ = auVar76._12_4_;
            auVar63 = auVar72 & auVar65 | auVar76;
            auVar63 = packssdw(auVar63,auVar63);
            auVar5._8_4_ = 0xffffffff;
            auVar5._0_8_ = 0xffffffffffffffff;
            auVar5._12_4_ = 0xffffffff;
            auVar63 = packssdw(auVar63 ^ auVar5,auVar63 ^ auVar5);
            if ((auVar63 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              pasVar49[uVar50 + 2] = asVar20;
            }
            auVar66 = pshufhw(auVar65,auVar65,0x84);
            auVar73 = pshufhw(auVar72,auVar72,0x84);
            auVar64 = pshufhw(auVar66,auVar76,0x84);
            auVar67._8_4_ = 0xffffffff;
            auVar67._0_8_ = 0xffffffffffffffff;
            auVar67._12_4_ = 0xffffffff;
            auVar67 = (auVar64 | auVar73 & auVar66) ^ auVar67;
            auVar66 = packssdw(auVar67,auVar67);
            if ((auVar66 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              pasVar49[uVar50 + 3] = asVar20;
            }
            auVar66 = auVar60 ^ auVar59;
            iVar55 = -(uint)((int)local_88 < auVar66._0_4_);
            auVar69._4_4_ = -(uint)(local_88._4_4_ < auVar66._4_4_);
            iVar36 = -(uint)(iStack_80 < auVar66._8_4_);
            auVar69._12_4_ = -(uint)(iStack_7c < auVar66._12_4_);
            auVar74._4_4_ = iVar55;
            auVar74._0_4_ = iVar55;
            auVar74._8_4_ = iVar36;
            auVar74._12_4_ = iVar36;
            auVar63 = pshuflw(auVar63,auVar74,0xe8);
            auVar68._4_4_ = -(uint)(auVar66._4_4_ == local_88._4_4_);
            auVar68._12_4_ = -(uint)(auVar66._12_4_ == iStack_7c);
            auVar68._0_4_ = auVar68._4_4_;
            auVar68._8_4_ = auVar68._12_4_;
            in_XMM8 = pshuflw(auVar81 & auVar79,auVar68,0xe8);
            in_XMM8 = in_XMM8 & auVar63;
            auVar69._0_4_ = auVar69._4_4_;
            auVar69._8_4_ = auVar69._12_4_;
            auVar63 = pshuflw(auVar63,auVar69,0xe8);
            auVar79._8_4_ = 0xffffffff;
            auVar79._0_8_ = 0xffffffffffffffff;
            auVar79._12_4_ = 0xffffffff;
            auVar79 = (auVar63 | in_XMM8) ^ auVar79;
            auVar63 = packssdw(auVar79,auVar79);
            if ((auVar63 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              pasVar49[uVar50 + 4] = asVar20;
            }
            auVar69 = auVar68 & auVar74 | auVar69;
            auVar63 = packssdw(auVar69,auVar69);
            auVar81._8_4_ = 0xffffffff;
            auVar81._0_8_ = 0xffffffffffffffff;
            auVar81._12_4_ = 0xffffffff;
            auVar63 = packssdw(auVar63 ^ auVar81,auVar63 ^ auVar81);
            if ((auVar63 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
              pasVar49[uVar50 + 5] = asVar20;
            }
            auVar63 = auVar62 ^ auVar59;
            iVar55 = -(uint)((int)local_88 < auVar63._0_4_);
            auVar77._4_4_ = -(uint)(local_88._4_4_ < auVar63._4_4_);
            iVar36 = -(uint)(iStack_80 < auVar63._8_4_);
            auVar77._12_4_ = -(uint)(iStack_7c < auVar63._12_4_);
            auVar70._4_4_ = iVar55;
            auVar70._0_4_ = iVar55;
            auVar70._8_4_ = iVar36;
            auVar70._12_4_ = iVar36;
            auVar75._4_4_ = -(uint)(auVar63._4_4_ == local_88._4_4_);
            auVar75._12_4_ = -(uint)(auVar63._12_4_ == iStack_7c);
            auVar75._0_4_ = auVar75._4_4_;
            auVar75._8_4_ = auVar75._12_4_;
            auVar77._0_4_ = auVar77._4_4_;
            auVar77._8_4_ = auVar77._12_4_;
            auVar63 = auVar75 & auVar70 | auVar77;
            auVar63 = packssdw(auVar63,auVar63);
            auVar6._8_4_ = 0xffffffff;
            auVar6._0_8_ = 0xffffffffffffffff;
            auVar6._12_4_ = 0xffffffff;
            in_XMM7 = packssdw(auVar63 ^ auVar6,auVar63 ^ auVar6);
            if ((in_XMM7 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              pasVar49[uVar50 + 6] = asVar20;
            }
            auVar63 = pshufhw(auVar70,auVar70,0x84);
            auVar64 = pshufhw(auVar75,auVar75,0x84);
            auVar66 = pshufhw(auVar63,auVar77,0x84);
            auVar71._8_4_ = 0xffffffff;
            auVar71._0_8_ = 0xffffffffffffffff;
            auVar71._12_4_ = 0xffffffff;
            auVar71 = (auVar66 | auVar64 & auVar63) ^ auVar71;
            auVar63 = packssdw(auVar71,auVar71);
            if ((auVar63 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              pasVar49[uVar50 + 7] = asVar20;
            }
            uVar50 = uVar50 + 8;
            lVar25 = auVar78._8_8_;
            auVar78._0_8_ = auVar78._0_8_ + 8;
            auVar78._8_8_ = lVar25 + 8;
            lVar25 = auVar58._8_8_;
            auVar58._0_8_ = auVar58._0_8_ + 8;
            auVar58._8_8_ = lVar25 + 8;
            lVar25 = auVar60._8_8_;
            auVar60._0_8_ = auVar60._0_8_ + 8;
            auVar60._8_8_ = lVar25 + 8;
            lVar25 = auVar62._8_8_;
            auVar62._0_8_ = auVar62._0_8_ + 8;
            auVar62._8_8_ = lVar25 + 8;
          } while (((int)uVar22 + 7U & 0xfffffff8) != uVar50);
        }
        puVar24[(int)(uVar8 - 1)] = uVar23;
        puVar24 = puVar24 + lVar48;
        __s = __s + lVar48;
        iVar9 = iVar9 + 1;
        pasVar49 = pasVar49 + lVar48;
      } while (iVar9 != iVar45);
      uVar10 = core->cu_log2w;
      bVar40 = (byte)core->cu_log2h;
      asVar20[1] = '\0';
      asVar20[0] = core->refi[0];
      bVar34 = core->affine_flag;
    }
    bVar51 = (byte)uVar10;
    uVar10 = (1 << (bVar51 & 0x1f)) >> 2;
    iVar45 = (1 << (bVar40 & 0x1f)) >> 2;
    if ((char)asVar20[0] < '\0') {
      local_120 = (core->map).map_mv;
    }
    else {
      local_120 = (core->map).map_mv;
      if (-1 < core->refi[1]) {
        iVar9 = core->affine_mv[0][0][0];
        iVar55 = core->affine_mv[0][0][1];
        iVar21 = (core->affine_mv[0][1][0] - iVar9) * 0x80 >> (bVar51 & 0x1f);
        iVar43 = (core->affine_mv[0][1][1] - iVar55) * 0x80 >> (bVar51 & 0x1f);
        iVar36 = core->affine_mv[1][0][0];
        iVar53 = core->affine_mv[1][0][1];
        iVar52 = (core->affine_mv[1][1][0] - iVar36) * 0x80 >> (bVar51 & 0x1f);
        iVar18 = (core->affine_mv[1][1][1] - iVar53) * 0x80 >> (bVar51 & 0x1f);
        if (bVar34 == 2) {
          local_ac = (core->affine_mv[0][2][0] - iVar9) * 0x80 >> (bVar40 & 0x1f);
          local_b0 = (core->affine_mv[0][2][1] - iVar55) * 0x80 >> (bVar40 & 0x1f);
          local_b4 = (core->affine_mv[1][2][0] - iVar36) * 0x80 >> (bVar40 & 0x1f);
          local_b8 = (core->affine_mv[1][2][1] - iVar53) * 0x80 >> (bVar40 & 0x1f);
        }
        else {
          local_ac = -iVar43;
          local_b4 = -iVar18;
          local_b8 = iVar52;
          local_b0 = iVar21;
        }
        if (0 < iVar45) {
          local_c0 = local_120 + lVar12;
          local_88 = core->affine_sb_mv;
          uVar38 = iVar9 * 0x80;
          uVar32 = iVar55 * 0x80;
          paasVar30 = core->affine_sb_mv + 1;
          uVar26 = iVar36 * 0x80;
          uVar54 = iVar53 * 0x80;
          local_120 = local_120 + lVar12 + lVar48 + 1;
          iVar9 = 0;
          do {
            if (0 < (int)uVar10) {
              iVar55 = iVar9 * 4 + 4;
              uVar41 = iVar55 * local_ac + uVar38 + iVar21 * 4;
              uVar42 = iVar55 * local_b0 + uVar32 + iVar43 * 4;
              uVar39 = iVar55 * local_b4 + uVar26 + iVar52 * 4;
              uVar56 = iVar55 * local_b8 + uVar54 + iVar18 * 4;
              lVar25 = 0;
              lVar12 = 0;
              do {
                uVar28 = uVar38;
                uVar46 = uVar32;
                uVar47 = uVar26;
                uVar27 = uVar54;
                if ((iVar9 != 0 || (int)lVar12 != 0) &&
                   (((iVar9 != 0 ||
                     (uVar28 = (iVar21 << (bVar51 & 0x1f)) + uVar38,
                     uVar46 = (iVar43 << (bVar51 & 0x1f)) + uVar32,
                     uVar47 = (iVar52 << (bVar51 & 0x1f)) + uVar26,
                     uVar27 = (iVar18 << (bVar51 & 0x1f)) + uVar54, (ulong)uVar10 - 2 != lVar12)) &&
                    (uVar28 = (local_ac << (bVar40 & 0x1f)) + uVar38,
                    uVar46 = (local_b0 << (bVar40 & 0x1f)) + uVar32,
                    uVar47 = (local_b4 << (bVar40 & 0x1f)) + uVar26,
                    uVar27 = (local_b8 << (bVar40 & 0x1f)) + uVar54,
                    lVar12 != 0 || (iVar9 + 2 != iVar45 || bVar34 != 2))))) {
                  uVar28 = uVar41;
                  uVar46 = uVar42;
                  uVar47 = uVar39;
                  uVar27 = uVar56;
                }
                uVar11 = 0;
                uVar15 = 0;
                if (uVar28 != 0) {
                  if ((int)uVar28 < 1) {
                    uVar28 = 0x40 - uVar28 >> 7;
                    uVar11 = -uVar28;
                    if ((int)uVar11 < -0x1ffff) {
                      uVar11 = 0xfffe0000;
                    }
                    uVar15 = -(uVar28 + 2 >> 2);
                    if ((int)uVar15 < -0x7fff) {
                      uVar15 = 0xffff8000;
                    }
                  }
                  else {
                    uVar11 = uVar28 + 0x40 >> 7;
                    if (0xffffbf < uVar28) {
                      uVar11 = 0x1ffff;
                    }
                    uVar15 = uVar11 + 2 >> 2;
                    if (0x7ffe < uVar15) {
                      uVar15 = 0x7fff;
                    }
                  }
                }
                uVar22 = (ulong)uVar11;
                uVar28 = 0;
                if (uVar46 != 0) {
                  if ((int)uVar46 < 1) {
                    uVar46 = 0x40 - uVar46 >> 7;
                    uVar28 = -uVar46;
                    uVar50 = (ulong)uVar28;
                    if ((int)uVar28 < -0x1ffff) {
                      uVar50 = 0xfffe0000;
                    }
                    uVar22 = uVar22 | uVar50 << 0x20;
                    uVar28 = -(uVar46 + 2 >> 2);
                    if ((int)uVar28 < -0x7fff) {
                      uVar28 = 0xffff8000;
                    }
                  }
                  else {
                    uVar28 = uVar46 + 0x40 >> 7;
                    if (0xffffbf < uVar46) {
                      uVar28 = 0x1ffff;
                    }
                    uVar22 = CONCAT44(uVar28,uVar11);
                    uVar28 = uVar28 + 2 >> 2;
                    if (0x7ffe < uVar28) {
                      uVar28 = 0x7fff;
                    }
                  }
                }
                uVar50 = 0;
                uVar46 = 0;
                uVar11 = 0;
                if (uVar47 != 0) {
                  if ((int)uVar47 < 1) {
                    uVar47 = 0x40 - uVar47 >> 7;
                    uVar46 = -uVar47;
                    if ((int)uVar46 < -0x1ffff) {
                      uVar46 = 0xfffe0000;
                    }
                    uVar11 = -(uVar47 + 2 >> 2);
                    if ((int)uVar11 < -0x7fff) {
                      uVar11 = 0xffff8000;
                    }
                  }
                  else {
                    uVar46 = uVar47 + 0x40 >> 7;
                    if (0xffffbf < uVar47) {
                      uVar46 = 0x1ffff;
                    }
                    uVar11 = uVar46 + 2 >> 2;
                    if (0x7ffe < uVar11) {
                      uVar11 = 0x7fff;
                    }
                  }
                }
                uVar44 = (ulong)uVar46;
                if (uVar27 != 0) {
                  if ((int)uVar27 < 1) {
                    uVar47 = 0x40 - uVar27 >> 7;
                    uVar46 = -uVar47;
                    uVar50 = (ulong)uVar46;
                    if ((int)uVar46 < -0x1ffff) {
                      uVar50 = 0xfffe0000;
                    }
                    uVar44 = uVar44 | uVar50 << 0x20;
                    uVar46 = -(uVar47 + 2 >> 2);
                    uVar50 = (ulong)uVar46;
                    if ((int)uVar46 < -0x7fff) {
                      uVar50 = 0xffff8000;
                    }
                  }
                  else {
                    uVar47 = uVar27 + 0x40 >> 7;
                    if (0xffffbf < uVar27) {
                      uVar47 = 0x1ffff;
                    }
                    uVar44 = CONCAT44(uVar47,uVar46);
                    uVar46 = uVar47 + 2 >> 2;
                    if (0x7ffe < uVar46) {
                      uVar46 = 0x7fff;
                    }
                    uVar50 = (ulong)uVar46;
                  }
                }
                aasVar16 = (s16  [2] [2])
                           ((ulong)(uVar15 & 0xffff) |
                           (ulong)(uVar28 << 0x10) |
                           (ulong)(uVar11 & 0xffff) << 0x20 | uVar50 << 0x30);
                local_c0[lVar12] = aasVar16;
                local_c0[lVar12 + 1] = aasVar16;
                local_120[lVar12 + -1] = aasVar16;
                local_120[lVar12] = aasVar16;
                *(ulong *)((*local_88)[0] + lVar12) = uVar22;
                *(ulong *)((*paasVar30)[0] + lVar12) = uVar44;
                lVar12 = lVar12 + 2;
                uVar41 = uVar41 + iVar21 * 8;
                uVar42 = uVar42 + iVar43 * 8;
                uVar39 = uVar39 + iVar52 * 8;
                uVar56 = uVar56 + iVar18 * 8;
                lVar25 = lVar25 + -8;
              } while (lVar12 < (int)uVar10);
              local_88 = (s32 (*) [1024] [2])((long)local_88 - lVar25);
              paasVar30 = (s32 (*) [1024] [2])((long)paasVar30 - lVar25);
            }
            iVar9 = iVar9 + 2;
            local_120 = local_120 + iVar31 * 2;
            local_c0 = local_c0 + iVar31 * 2;
          } while (iVar9 < iVar45);
        }
        goto LAB_0010c672;
      }
    }
    bVar19 = asVar20[0] >> 7;
    iVar9 = core->affine_mv[bVar19][0][0];
    iVar36 = (core->affine_mv[bVar19][1][0] - iVar9) * 0x80 >> (bVar51 & 0x1f);
    iVar55 = core->affine_mv[bVar19][0][1];
    iVar53 = (core->affine_mv[bVar19][1][1] - iVar55) * 0x80 >> (bVar51 & 0x1f);
    if (bVar34 == 2) {
      iVar21 = (core->affine_mv[bVar19][2][0] - iVar9) * 0x80 >> (bVar40 & 0x1f);
      iVar18 = (core->affine_mv[bVar19][2][1] - iVar55) * 0x80 >> (bVar40 & 0x1f);
    }
    else {
      iVar21 = -iVar53;
      iVar18 = iVar36;
    }
    local_138 = core->affine_sb_mv + bVar19;
    uVar26 = iVar9 * 0x80;
    uVar32 = iVar55 * 0x80;
    if (core->pichdr->affine_subblock_size_idx == 1) {
      if (0 < iVar45) {
        lVar25 = (long)local_120[1][0] + (lVar48 * 8 + lVar12 * 8 | (ulong)bVar19 * 4);
        pasVar33 = local_120[lVar12 + 1] + bVar19;
        iVar9 = 0;
        do {
          if (0 < (int)uVar10) {
            iVar55 = iVar9 * 4 + 4;
            uVar38 = iVar55 * iVar21 + uVar26 + iVar36 * 4;
            uVar54 = iVar55 * iVar18 + uVar32 + iVar53 * 4;
            lVar29 = 0;
            lVar12 = 0;
            do {
              uVar39 = uVar26;
              uVar41 = uVar32;
              if (((iVar9 != 0 || (int)lVar12 != 0) &&
                  ((iVar9 != 0 ||
                   (uVar39 = (iVar36 << (bVar51 & 0x1f)) + uVar26,
                   uVar41 = (iVar53 << (bVar51 & 0x1f)) + uVar32, (ulong)uVar10 - 2 != lVar12)))) &&
                 (uVar39 = (iVar21 << (bVar40 & 0x1f)) + uVar26,
                 uVar41 = (iVar18 << (bVar40 & 0x1f)) + uVar32,
                 (iVar9 + 2 != iVar45 || bVar34 != 2) || lVar12 != 0)) {
                uVar39 = uVar38;
                uVar41 = uVar54;
              }
              uVar35 = 0;
              uVar22 = 0;
              if (uVar39 != 0) {
                if ((int)uVar39 < 1) {
                  uVar42 = 0x40 - uVar39 >> 7;
                  uVar39 = -uVar42;
                  if ((int)uVar39 < -0x1ffff) {
                    uVar39 = 0xfffe0000;
                  }
                  uVar22 = (ulong)uVar39;
                  iVar55 = -(uVar42 + 2 >> 2);
                  uVar35 = (ushort)iVar55;
                  if (iVar55 < -0x7fff) {
                    uVar35 = 0x8000;
                  }
                }
                else {
                  uVar42 = uVar39 + 0x40 >> 7;
                  if (0xffffbf < uVar39) {
                    uVar42 = 0x1ffff;
                  }
                  uVar22 = (ulong)uVar42;
                  uVar39 = uVar42 + 2 >> 2;
                  if (0x7ffe < uVar39) {
                    uVar39 = 0x7fff;
                  }
                  uVar35 = (ushort)uVar39;
                }
              }
              uVar50 = 0;
              uVar39 = 0;
              if (uVar41 != 0) {
                if ((int)uVar41 < 1) {
                  uVar39 = 0x40 - uVar41 >> 7;
                  uVar41 = -uVar39;
                  uVar50 = (ulong)uVar41;
                  if ((int)uVar41 < -0x1ffff) {
                    uVar50 = 0xfffe0000;
                  }
                  uVar39 = -(uVar39 + 2 >> 2);
                  if ((int)uVar39 < -0x7fff) {
                    uVar39 = 0xffff8000;
                  }
                }
                else {
                  uVar39 = uVar41 + 0x40 >> 7;
                  if (0xffffbf < uVar41) {
                    uVar39 = 0x1ffff;
                  }
                  uVar50 = (ulong)uVar39;
                  uVar39 = uVar39 + 2 >> 2;
                  if (0x7ffe < uVar39) {
                    uVar39 = 0x7fff;
                  }
                }
              }
              asVar37 = (s16  [2])((uint)uVar35 | uVar39 << 0x10);
              pasVar33[lVar12 * 2 + -2] = asVar37;
              pasVar33[lVar12 * 2] = asVar37;
              *(s16 (*) [2])(lVar25 + -8 + lVar12 * 8) = asVar37;
              *(s16 (*) [2])(lVar25 + lVar12 * 8) = asVar37;
              *(ulong *)((*local_138)[0] + lVar12) = uVar22 | uVar50 << 0x20;
              lVar12 = lVar12 + 2;
              uVar38 = uVar38 + iVar36 * 8;
              uVar54 = uVar54 + iVar53 * 8;
              lVar29 = lVar29 + -8;
            } while (lVar12 < (int)uVar10);
            local_138 = (s32 (*) [1024] [2])((long)local_138 - lVar29);
          }
          iVar9 = iVar9 + 2;
          lVar25 = lVar25 + (long)(iVar31 * 2) * 8;
          pasVar33 = pasVar33 + (long)(iVar31 * 2) * 2;
        } while (iVar9 < iVar45);
      }
    }
    else if (0 < iVar45) {
      pasVar33 = local_120[lVar12] + bVar19;
      uVar54 = uVar26 + iVar21 * 2 + iVar36 * 2;
      uVar38 = uVar32 + iVar18 * 2 + iVar53 * 2;
      iVar9 = 0;
      do {
        if (0 < (int)uVar10) {
          lVar12 = 0;
          uVar22 = 0;
          uVar39 = uVar54;
          uVar41 = uVar38;
          do {
            uVar42 = uVar26;
            uVar56 = uVar32;
            if (((iVar9 != 0 || (int)uVar22 != 0) &&
                ((iVar9 != 0 ||
                 (uVar42 = (iVar36 << (bVar51 & 0x1f)) + uVar26,
                 uVar56 = (iVar53 << (bVar51 & 0x1f)) + uVar32, uVar10 - 1 != uVar22)))) &&
               (uVar42 = (iVar21 << (bVar40 & 0x1f)) + uVar26,
               uVar56 = (iVar18 << (bVar40 & 0x1f)) + uVar32,
               (iVar9 != iVar45 + -1 || bVar34 != 2) || uVar22 != 0)) {
              uVar42 = uVar39;
              uVar56 = uVar41;
            }
            uVar35 = 0;
            uVar50 = 0;
            if (uVar42 != 0) {
              if ((int)uVar42 < 1) {
                uVar28 = 0x40 - uVar42 >> 7;
                uVar42 = -uVar28;
                if ((int)uVar42 < -0x1ffff) {
                  uVar42 = 0xfffe0000;
                }
                uVar50 = (ulong)uVar42;
                iVar31 = -(uVar28 + 2 >> 2);
                uVar35 = (ushort)iVar31;
                if (iVar31 < -0x7fff) {
                  uVar35 = 0x8000;
                }
              }
              else {
                uVar28 = uVar42 + 0x40 >> 7;
                if (0xffffbf < uVar42) {
                  uVar28 = 0x1ffff;
                }
                uVar50 = (ulong)uVar28;
                uVar42 = uVar28 + 2 >> 2;
                if (0x7ffe < uVar42) {
                  uVar42 = 0x7fff;
                }
                uVar35 = (ushort)uVar42;
              }
            }
            uVar44 = 0;
            uVar42 = 0;
            if (uVar56 != 0) {
              if ((int)uVar56 < 1) {
                uVar56 = 0x40 - uVar56 >> 7;
                uVar42 = -uVar56;
                if ((int)uVar42 < -0x1ffff) {
                  uVar42 = 0xfffe0000;
                }
                uVar44 = (ulong)uVar42;
                uVar42 = -(uVar56 + 2 >> 2);
                if ((int)uVar42 < -0x7fff) {
                  uVar42 = 0xffff8000;
                }
              }
              else {
                uVar42 = uVar56 + 0x40 >> 7;
                if (0xffffbf < uVar56) {
                  uVar42 = 0x1ffff;
                }
                uVar44 = (ulong)uVar42;
                uVar42 = uVar42 + 2 >> 2;
                if (0x7ffe < uVar42) {
                  uVar42 = 0x7fff;
                }
              }
            }
            pasVar33[uVar22 * 2] = (s16  [2])((uint)uVar35 | uVar42 << 0x10);
            (*local_138)[uVar22] = (s32  [2])(uVar50 | uVar44 << 0x20);
            uVar22 = uVar22 + 1;
            uVar39 = uVar39 + iVar36 * 4;
            uVar41 = uVar41 + iVar53 * 4;
            lVar12 = lVar12 + -8;
          } while (uVar10 != uVar22);
          local_138 = (s32 (*) [1024] [2])((long)local_138 - lVar12);
        }
        iVar9 = iVar9 + 1;
        pasVar33 = pasVar33 + lVar48 * 2;
        uVar54 = uVar54 + iVar21 * 4;
        uVar38 = uVar38 + iVar18 * 4;
      } while (iVar9 != iVar45);
    }
  }
LAB_0010c672:
  if (uVar14 == 0x1f) {
    return;
  }
LAB_0010c67d:
  auVar82 = _DAT_00163a40;
  uVar22 = 1;
  if (1 < (int)uVar8) {
    uVar22 = (ulong)uVar8;
  }
  lVar12 = uVar22 - 1;
  auVar57._8_4_ = (int)lVar12;
  auVar57._0_8_ = lVar12;
  auVar57._12_4_ = (int)((ulong)lVar12 >> 0x20);
  lVar12 = 0;
  auVar57 = auVar57 ^ _DAT_00163a40;
  auVar59 = _DAT_00163a20;
  auVar61 = _DAT_00163a30;
  do {
    auVar78 = auVar61 ^ auVar82;
    iVar45 = auVar57._4_4_;
    if ((bool)(~(auVar78._4_4_ == iVar45 && auVar57._0_4_ < auVar78._0_4_ || iVar45 < auVar78._4_4_)
              & 1)) {
      *(uint *)((long)puVar24 + lVar12 + lVar48 * -4) = uVar23;
    }
    if ((auVar78._12_4_ != auVar57._12_4_ || auVar78._8_4_ <= auVar57._8_4_) &&
        auVar78._12_4_ <= auVar57._12_4_) {
      *(uint *)((long)puVar24 + lVar12 + lVar48 * -4 + 4) = uVar23;
    }
    auVar78 = auVar59 ^ auVar82;
    iVar9 = auVar78._4_4_;
    if (iVar9 <= iVar45 && (iVar9 != iVar45 || auVar78._0_4_ <= auVar57._0_4_)) {
      *(uint *)((long)puVar24 + lVar12 + lVar48 * -4 + 8) = uVar23;
      *(uint *)((long)puVar24 + lVar12 + lVar48 * -4 + 0xc) = uVar23;
    }
    lVar25 = auVar61._8_8_;
    auVar61._0_8_ = auVar61._0_8_ + 4;
    auVar61._8_8_ = lVar25 + 4;
    lVar25 = auVar59._8_8_;
    auVar59._0_8_ = auVar59._0_8_ + 4;
    auVar59._8_8_ = lVar25 + 4;
    lVar12 = lVar12 + 0x10;
  } while ((ulong)((int)uVar22 + 3U & 0xfffffffc) << 2 != lVar12);
  return;
}

Assistant:

void dec_update_map(com_core_t * core)
{
    int i, j;
    int scup  = core->cu_scup;
    int i_scu = core->seqhdr->i_scu;
    int w_cu = 1 << (core->cu_log2w - MIN_CU_LOG2);
    int h_cu = 1 << (core->cu_log2h - MIN_CU_LOG2);
    s8  (*map_refi)[REFP_NUM]       = core->map.map_refi + scup;
    s16 (*map_mv)  [REFP_NUM][MV_D] = core->map.map_mv   + scup;
    u32  *map_pos                   = core->map.map_pos  + scup;
    com_scu_t *map_scu              = core->map.map_scu  + scup;
    u32 cu_pos = 0;
    com_scu_t scu = { 0 };
    s16 (*mv)[MV_D] = core->mv;
    u16 refi = M16(core->refi);
    
    scu.coded  = 1;
    scu.intra  = core->cu_mode == MODE_INTRA;
    scu.inter  = !scu.intra;
    scu.affine = core->affine_flag;
    scu.skip   = core->cu_mode == MODE_SKIP;
    scu.cbf = M32(core->cbfy) || M16(core->cbfc) || scu.intra; // only used for deblock

    MCU_SET_LOGW(cu_pos, core->cu_log2w);
    MCU_SET_LOGH(cu_pos, core->cu_log2h);
    MCU_SET_SCUP(cu_pos, core->cu_scup);

    if (core->affine_flag) {
        for (i = 0; i < h_cu; i++) {
            memset(map_scu, *(u8*)&scu, w_cu);
            for (j = 0; j < w_cu; j++) {
                M16(map_refi[j]) = refi;
            }
            map_pos[w_cu - 1] = cu_pos;
            map_refi += i_scu;
            map_mv   += i_scu;
            map_pos  += i_scu;
            map_scu  += i_scu;
        }
        set_affine_mvf(core, scup, core->cu_log2w, core->cu_log2h, i_scu, &core->map, core->pichdr);
    } else {
        if ((w_cu & 3) == 0) {
            u64 refi_64 = refi * 0x0001000100010001;
            u32 scu_32 = (*(u8*)&scu) * 0x01010101;
            uavs3d_union128_t mv_128 = { M64(mv), M64(mv) };

            for (i = 0; i < h_cu; i++) {
                for (j = 0; j < w_cu; j += 4) {
                    M32(map_scu + j) = scu_32;
                    M64(map_refi + j) = refi_64;
                    CP128(map_mv + j, &mv_128);
                    CP128(map_mv + j + 2, &mv_128);
                }
                map_pos[w_cu - 1] = cu_pos;
                map_refi += i_scu;
                map_mv   += i_scu;
                map_pos  += i_scu;
                map_scu  += i_scu;
            }
        } else if ((w_cu & 1) == 0) {
            u32 refi_32 = refi * 0x00010001;
            u16 scu_16 = (*(u8*)&scu) * 0x0101;
            uavs3d_union128_t mv_128 = { M64(mv), M64(mv) };

            for (i = 0; i < h_cu; i++) {
                M16(map_scu) = scu_16;
                M32(map_refi) = refi_32;
                CP128(map_mv, &mv_128);
                map_pos[w_cu - 1] = cu_pos;
                map_refi += i_scu;
                map_mv   += i_scu;
                map_pos  += i_scu;
                map_scu  += i_scu;
            }
        } else {
            for (i = 0; i < h_cu; i++) {
                *map_scu = scu;
                M16(map_refi) = refi;
                CP64(map_mv, mv);
                map_pos[0] = cu_pos;
                map_refi += i_scu;
                map_mv   += i_scu;
                map_pos  += i_scu;
                map_scu  += i_scu;
            }
        }
    }

    map_pos -= i_scu;

    for (j = 0; j < w_cu; j++) {
        map_pos[j] = cu_pos;
    }
}